

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O1

void __thiscall
icu_63::UCharsTrieBuilder::UCTLinearMatchNode::UCTLinearMatchNode
          (UCTLinearMatchNode *this,UChar *units,int32_t len,Node *nextNode)

{
  int32_t iVar1;
  int iVar2;
  
  iVar1 = 0;
  if (nextNode != (Node *)0x0) {
    iVar1 = nextNode->hash;
  }
  iVar2 = iVar1 + len * 0x25 + 0x11cccbbb;
  (this->super_LinearMatchNode).super_ValueNode.super_Node.hash = iVar2;
  (this->super_LinearMatchNode).super_ValueNode.super_Node.offset = 0;
  (this->super_LinearMatchNode).super_ValueNode.hasValue = '\0';
  (this->super_LinearMatchNode).super_ValueNode.value = 0;
  (this->super_LinearMatchNode).length = len;
  (this->super_LinearMatchNode).next = nextNode;
  (this->super_LinearMatchNode).super_ValueNode.super_Node.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UObject_0024d270;
  this->s = units;
  iVar1 = ustr_hashUCharsN_63(units,len);
  (this->super_LinearMatchNode).super_ValueNode.super_Node.hash = iVar1 + iVar2 * 0x25;
  return;
}

Assistant:

UCharsTrieBuilder::UCTLinearMatchNode::UCTLinearMatchNode(const UChar *units, int32_t len, Node *nextNode)
        : LinearMatchNode(len, nextNode), s(units) {
    hash=hash*37u+ustr_hashUCharsN(units, len);
}